

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O1

YSRESULT __thiscall YsSoundPlayer::SoundData::Resample(SoundData *this,int newRate)

{
  uint uVar1;
  YSBOOL YVar2;
  int atTimeStep;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uchar *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uchar *savePtr;
  uchar *puVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  
  uVar1 = this->rate;
  if (uVar1 != newRate) {
    YVar2 = this->stereo;
    uVar10 = (ulong)(this->bit >> 3);
    uVar12 = uVar10 << (YVar2 == YSTRUE);
    puVar8 = (uchar *)0x0;
    uVar6 = this->sizeInBytes / uVar12;
    uVar7 = ((long)newRate * uVar6) / (ulong)uVar1;
    uVar13 = uVar7 * uVar12;
    if (uVar13 != 0) {
      puVar8 = (uchar *)operator_new__(uVar13);
    }
    if ((ulong)uVar1 <= (long)newRate * uVar6 && puVar8 != (uchar *)0x0) {
      uVar9 = 0;
      puVar15 = puVar8;
      do {
        auVar22._8_4_ = (int)(uVar9 >> 0x20);
        auVar22._0_8_ = uVar9;
        auVar22._12_4_ = 0x45300000;
        dVar17 = (((auVar22._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) * (double)uVar6) /
                 (((double)CONCAT44(0x45300000,(int)(uVar7 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0));
        uVar11 = (long)(dVar17 - 9.223372036854776e+18) & (long)dVar17 >> 0x3f | (long)dVar17;
        dVar17 = fmod(dVar17,1.0);
        atTimeStep = (int)uVar11;
        lVar14 = 0;
        savePtr = puVar15;
        do {
          iVar5 = (int)lVar14;
          if (uVar11 < uVar6 - 1) {
            if (uVar11 < uVar6 - 2 && uVar11 != 0) {
              iVar3 = GetSignedValueRaw(this,iVar5,atTimeStep + -1);
              iVar4 = GetSignedValueRaw(this,iVar5,atTimeStep);
              dVar18 = (double)iVar4;
              iVar4 = GetSignedValueRaw(this,iVar5,atTimeStep + 1);
              dVar19 = (double)iVar4;
              iVar5 = GetSignedValueRaw(this,iVar5,atTimeStep + 2);
              dVar21 = ((double)(iVar3 + iVar4) - (dVar18 + dVar18)) * 0.5;
              dVar20 = ((((double)iVar5 - (dVar19 + dVar19)) - (dVar21 + dVar21)) + dVar18) / 6.0;
              dVar18 = (((dVar19 - dVar20) - dVar21) - dVar18) * dVar17 +
                       dVar20 * dVar17 * dVar17 * dVar17 + dVar21 * dVar17 * dVar17 + dVar18;
            }
            else {
              iVar3 = GetSignedValueRaw(this,iVar5,atTimeStep);
              iVar5 = GetSignedValueRaw(this,iVar5,atTimeStep + 1);
              dVar18 = (double)iVar5 * dVar17 + (double)iVar3 * (1.0 - dVar17);
            }
            iVar5 = (int)dVar18;
          }
          else {
            iVar5 = GetSignedValueRaw(this,iVar5,(int)(uVar6 - 1));
          }
          SetSignedValueRaw(this,savePtr,iVar5);
          if (YVar2 != YSTRUE) break;
          savePtr = savePtr + uVar10;
          bVar16 = lVar14 == 0;
          lVar14 = lVar14 + 1;
        } while (bVar16);
        uVar9 = uVar9 + 1;
        puVar15 = puVar15 + uVar12;
      } while (uVar9 < uVar7);
    }
    this->rate = newRate;
    if (this->dat != (uchar *)0x0) {
      operator_delete__(this->dat);
    }
    this->dat = puVar8;
    this->sizeInBytes = (uint)uVar13;
  }
  return YSOK;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::Resample(int newRate)
{
	if(rate!=newRate)
	{
		const size_t nChannel=(YSTRUE==stereo ? 2 : 1);
		const size_t bytePerSample=bit/8;
		const size_t bytePerTimeStep=nChannel*bytePerSample;
		const size_t curNTimeStep=sizeInBytes/bytePerTimeStep;

		const size_t newNTimeStep=curNTimeStep*newRate/rate;
		const size_t newSize=newNTimeStep*bytePerTimeStep;

		unsigned char *newDat=(0<newSize ? new unsigned char [newSize] : NULL);
		if(NULL!=newDat)
		{
			for(size_t ts=0; ts<newNTimeStep; ts++)
			{
				double oldTimeStepD=(double)curNTimeStep*(double)ts/(double)newNTimeStep;
				size_t oldTimeStep=(size_t)oldTimeStepD;
				double param=fmod(oldTimeStepD,1.0);
				unsigned char *newTimeStepPtr=newDat+ts*bytePerTimeStep;

				for(size_t ch=0; ch<nChannel; ++ch)
				{
					if(curNTimeStep-1<=oldTimeStep)
					{
						const int value=GetSignedValueRaw(ch,curNTimeStep-1);
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,value);
					}
					else if(0==oldTimeStep || curNTimeStep-2<=oldTimeStep)
					{
						const double value[2]=
							{
								(double)GetSignedValueRaw(ch,oldTimeStep),
								(double)GetSignedValueRaw(ch,oldTimeStep+1)
							};
						const int newValue=(int)(value[0]*(1.0-param)+value[1]*param);
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,newValue);
					}
					else
					{
						const double v[4]=
							{
								(double)GetSignedValueRaw(ch,oldTimeStep-1),  // At x=-1.0
								(double)GetSignedValueRaw(ch,oldTimeStep),    // At x= 0.0
								(double)GetSignedValueRaw(ch,oldTimeStep+1),  // At x= 1.0
								(double)GetSignedValueRaw(ch,oldTimeStep+2)   // At x= 2.0
							};

						// Cubic interpolation.  Linear didn't work well.
						// axxx+bxx+cx+d=e
						// x=-1  -> -a+b-c+d=v0   (A)
						// x= 0  ->        d=v1   (B)
						// x= 1  ->  a+b+c+d=v2   (C)
						// x= 2  -> 8a+4b+2c+d=v3 (D)
						//
						// (B) =>  d=v1;
						// (A)+(C) => 2b+2d=v0+v2  => b=(v0+v2-2d)/2
						//
						// (D)-2*(B) =>  6a+2b-d=v3-2*v2
						//           =>  a=(v3-2*v2-2b+d)/6

						const double d=v[1];
						const double b=(v[0]+v[2]-2.0*d)/2.0;
						const double a=(v[3]-2.0*v[2]-2.0*b+d)/6.0;
						const double c=v[2]-a-b-d;

						double newValue=a*param*param*param
							+b*param*param
							+c*param
							+d;
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,(int)newValue);
					}
				}
			}
		}

		rate=newRate;
		delete [] dat;
		dat=newDat;
		sizeInBytes=newSize;
	}
	return YSOK;
}